

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::CollationBuilder::getWeight16Before
          (CollationBuilder *this,int32_t index,int64_t node,int32_t level)

{
  int iVar1;
  int64_t *piVar2;
  uint32_t uVar3;
  uint32_t p;
  ulong uVar4;
  ulong uVar5;
  uint32_t s;
  uint uVar6;
  uint uVar7;
  
  iVar1 = (this->nodes).count;
  piVar2 = (this->nodes).elements;
  uVar4 = node;
  while (uVar6 = (uint)uVar4 & 3, 1 < uVar6) {
    uVar6 = (uint)(uVar4 >> 0x1c);
    uVar4 = 0;
    if ((int)(uVar6 & 0xfffff) < iVar1) {
      uVar4 = piVar2[uVar6 & 0xfffff];
    }
  }
  uVar3 = 0x500;
  if (((uint)node & 3) == 2) {
    uVar3 = (uint32_t)(ushort)((ulong)node >> 0x30);
  }
  uVar5 = uVar4;
  if ((uVar4 & 8) == 0) {
    while ((uVar5 & 3) != 0) {
      uVar7 = (uint)(uVar5 >> 0x1c);
      uVar5 = 0;
      if ((int)(uVar7 & 0xfffff) < iVar1) {
        uVar5 = piVar2[uVar7 & 0xfffff];
      }
    }
    s = 0x500;
    if (uVar6 == 1) {
      s = (uint32_t)(ushort)(uVar4 >> 0x30);
    }
    if ((uVar5 & 8) == 0) {
      p = (uint32_t)(uVar5 >> 0x20);
      if (level != 1) {
        uVar3 = CollationRootElements::getTertiaryBefore(&this->rootElements,p,s,uVar3);
        return uVar3;
      }
      uVar3 = CollationRootElements::getSecondaryBefore(&this->rootElements,p,s);
      return uVar3;
    }
  }
  return 0x100;
}

Assistant:

uint32_t
CollationBuilder::getWeight16Before(int32_t index, int64_t node, int32_t level) {
    U_ASSERT(strengthFromNode(node) < level || !isTailoredNode(node));
    // Collect the root CE weights if this node is for a root CE.
    // If it is not, then return the low non-primary boundary for a tailored CE.
    uint32_t t;
    if(strengthFromNode(node) == UCOL_TERTIARY) {
        t = weight16FromNode(node);
    } else {
        t = Collation::COMMON_WEIGHT16;  // Stronger node with implied common weight.
    }
    while(strengthFromNode(node) > UCOL_SECONDARY) {
        index = previousIndexFromNode(node);
        node = nodes.elementAti(index);
    }
    if(isTailoredNode(node)) {
        return Collation::BEFORE_WEIGHT16;
    }
    uint32_t s;
    if(strengthFromNode(node) == UCOL_SECONDARY) {
        s = weight16FromNode(node);
    } else {
        s = Collation::COMMON_WEIGHT16;  // Stronger node with implied common weight.
    }
    while(strengthFromNode(node) > UCOL_PRIMARY) {
        index = previousIndexFromNode(node);
        node = nodes.elementAti(index);
    }
    if(isTailoredNode(node)) {
        return Collation::BEFORE_WEIGHT16;
    }
    // [p, s, t] is a root CE. Return the preceding weight for the requested level.
    uint32_t p = weight32FromNode(node);
    uint32_t weight16;
    if(level == UCOL_SECONDARY) {
        weight16 = rootElements.getSecondaryBefore(p, s);
    } else {
        weight16 = rootElements.getTertiaryBefore(p, s, t);
        U_ASSERT((weight16 & ~Collation::ONLY_TERTIARY_MASK) == 0);
    }
    return weight16;
}